

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::clearPredList(Graph *this)

{
  vector<int,_std::allocator<int>_> *vec;
  vector<int,_std::allocator<int>_> *__end1;
  vector<int,_std::allocator<int>_> *__begin1;
  vector<int,_std::allocator<int>_> (*__range1) [50];
  Graph *this_local;
  
  for (__end1 = this->pred_list; (Graph *)__end1 != this + 1; __end1 = __end1 + 1) {
    std::vector<int,_std::allocator<int>_>::resize(__end1,1);
    std::vector<int,_std::allocator<int>_>::clear(__end1);
  }
  return;
}

Assistant:

void Graph::clearPredList(){
   for(auto &vec : this->pred_list){
      vec.resize(1);
      vec.clear();
   }
   return void();
}